

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

string * __thiscall
chaiscript::eval::Fun_Call_AST_Node::pretty_print_abi_cxx11_
          (string *__return_storage_ptr__,Fun_Call_AST_Node *this)

{
  pointer psVar1;
  int iVar2;
  pointer psVar3;
  bool bVar4;
  ostringstream oss;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  psVar3 = (this->super_AST_Node).children.
           super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->super_AST_Node).children.
           super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar3 != psVar1) {
    iVar2 = 0;
    do {
      (**((psVar3->super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
         _vptr_AST_Node)(&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      bVar4 = iVar2 == 0;
      iVar2 = iVar2 + -1;
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
      }
      psVar3 = psVar3 + 1;
    } while (psVar3 != psVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string pretty_print() const CHAISCRIPT_OVERRIDE 
        {
          std::ostringstream oss;

          int count = 0;
          for (const auto &child : this->children) {
            oss << child->pretty_print();

            if (count == 0)
            {
              oss << "(";
            }
            ++count;
          }

          oss << ")";

          return oss.str();
        }